

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QSqlRecord __thiscall QSQLiteDriver::record(QSQLiteDriver *this,QString *tablename)

{
  ulong uVar1;
  QSqlResult *pQVar2;
  long *in_RSI;
  QSqlRecordPrivate *in_RDI;
  long in_FS_OFFSET;
  QSQLiteDriverPrivate *d;
  QSqlQuery q;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> this_00;
  QSqlIndex local_60 [15];
  undefined1 in_stack_ffffffffffffffaf;
  QString *in_stack_ffffffffffffffb0;
  QSqlQuery *in_stack_ffffffffffffffb8;
  QSQLiteDriverPrivate *in_stack_ffffffffffffffc0;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)in_RDI;
  d_func((QSQLiteDriver *)0x119196);
  uVar1 = (**(code **)(*in_RSI + 0x60))();
  if ((uVar1 & 1) == 0) {
    QSqlRecord::QSqlRecord((QSqlRecord *)in_RDI);
  }
  else {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QSqlResult *)(**(code **)(*in_RSI + 200))();
    QSqlQuery::QSqlQuery((QSqlQuery *)&local_10,pQVar2);
    QSqlQuery::setForwardOnly(SUB81(&local_10,0));
    QSQLiteDriverPrivate::getTableInfo
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               (bool)in_stack_ffffffffffffffaf);
    QSqlRecord::QSqlRecord((QSqlRecord *)this_00.d.ptr,(QSqlRecord *)in_RDI);
    QSqlIndex::~QSqlIndex(local_60);
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
           (QExplicitlySharedDataPointer<QSqlRecordPrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSqlRecord QSQLiteDriver::record(const QString &tablename) const
{
    Q_D(const QSQLiteDriver);
    if (!isOpen())
        return QSqlRecord();

    QSqlQuery q(createResult());
    q.setForwardOnly(true);
    return d->getTableInfo(q, tablename);
}